

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void nlohmann::detail::
     serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::throw_if_invalid_utf8(string *str)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  ostream *poVar4;
  undefined8 uVar5;
  void *pvVar6;
  type_error *ptVar7;
  string local_420 [35];
  char local_3fd;
  int local_3fc;
  stringstream local_3f8 [8];
  stringstream ss_1;
  ostream local_3e8 [383];
  undefined1 local_269;
  __cxx11 local_248 [32];
  char local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [35];
  char local_1c5;
  int local_1b4;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  ulong uStack_20;
  uint8_t byte;
  size_t i;
  string *psStack_10;
  uint8_t state;
  string *str_local;
  
  i._7_1_ = '\0';
  uStack_20 = 0;
  psStack_10 = str;
  while( true ) {
    uVar1 = uStack_20;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
      if (i._7_1_ != '\0') {
        std::__cxx11::stringstream::stringstream(local_3f8);
        local_3fc = (int)std::setw(2);
        poVar4 = std::operator<<(local_3e8,(_Setw)local_3fc);
        uVar5 = std::ostream::operator<<(poVar4,std::uppercase);
        local_3fd = (char)std::setfill<char>('0');
        poVar4 = std::operator<<(uVar5,local_3fd);
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
        pbVar3 = (byte *)std::__cxx11::string::back();
        std::ostream::operator<<(pvVar6,(uint)*pbVar3);
        ptVar7 = (type_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringstream::str();
        std::operator+((char *)local_420,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "incomplete UTF-8 string; last byte: 0x");
        type_error::create(ptVar7,0x13c,local_420);
        __cxa_throw(ptVar7,&type_error::typeinfo,type_error::~type_error);
      }
      return;
    }
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)psStack_10);
    local_21 = *pbVar3;
    decode((uint8_t *)((long)&i + 7),local_21);
    if (i._7_1_ == '\x01') break;
    uStack_20 = uStack_20 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1b4 = (int)std::setw(2);
  poVar4 = std::operator<<(local_1a0,(_Setw)local_1b4);
  uVar5 = std::ostream::operator<<(poVar4,std::uppercase);
  local_1c5 = (char)std::setfill<char>('0');
  poVar4 = std::operator<<(uVar5,local_1c5);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
  std::ostream::operator<<(pvVar6,(uint)local_21);
  local_269 = 1;
  ptVar7 = (type_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::to_string(local_248,uStack_20);
  std::operator+(local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "invalid UTF-8 byte at index ");
  std::operator+(local_208,local_228);
  std::__cxx11::stringstream::str();
  std::operator+(local_1e8,local_208);
  type_error::create(ptVar7,0x13c,local_1e8);
  local_269 = 0;
  __cxa_throw(ptVar7,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

static void throw_if_invalid_utf8(const std::string& str)
    {
        // start with state 0 (= accept)
        uint8_t state = 0;

        for (size_t i = 0; i < str.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(str[i]);
            decode(state, byte);
            if (state == 1)
            {
                // state 1 means reject
                std::stringstream ss;
                ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
                JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
            }
        }

        if (state != 0)
        {
            // we finish reading, but do not accept: string was incomplete
            std::stringstream ss;
            ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(str.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
        }
    }